

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus.c
# Opt level: O0

int32 ctl_read_entry(FILE *fp,char *uttfile,int32 *sf,int32 *ef,char *uttid)

{
  char *pcVar1;
  size_t sVar2;
  int local_4044;
  int32 k;
  char *base;
  char line [16384];
  char *uttid_local;
  int32 *ef_local;
  int32 *sf_local;
  char *uttfile_local;
  FILE *fp_local;
  
  line._16376_8_ = uttid;
  do {
    pcVar1 = fgets((char *)&base,0x4000,(FILE *)fp);
    if (pcVar1 == (char *)0x0) {
      return -1;
    }
    if ((char)base == '#') {
      local_4044 = 0;
    }
    else {
      local_4044 = __isoc99_sscanf(&base,"%s %d %d %s",uttfile,sf,ef,line._16376_8_);
    }
  } while (local_4044 < 1);
  if ((local_4044 != 2) && ((local_4044 < 3 || ((*sf < *ef && (-1 < *sf)))))) {
    if (local_4044 < 4) {
      pcVar1 = path2basename(uttfile);
      strcpy((char *)line._16376_8_,pcVar1);
      if (local_4044 == 3) {
        sVar2 = strlen((char *)line._16376_8_);
        sprintf((char *)(line._16376_8_ + (long)(int)sVar2),"_%d_%d",(ulong)(uint)*sf,
                (ulong)(uint)*ef);
      }
      else {
        *sf = 0;
        *ef = -1;
      }
    }
    return 0;
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/corpus.c"
          ,0x1a2,"Error in ctlfile: %s\n",&base);
  exit(1);
}

Assistant:

int32
ctl_read_entry(FILE * fp, char *uttfile, int32 * sf, int32 * ef,
               char *uttid)
{
    char line[16384];
    const char *base;
    int32 k;

    do {
        if (fgets(line, sizeof(line), fp) == NULL)
            return -1;
        if (line[0] == '#')
            k = 0;
        else
            k = sscanf(line, "%s %d %d %s", uttfile, sf, ef, uttid);
    } while (k <= 0);

    if ((k == 2) || ((k >= 3) && ((*sf >= *ef) || (*sf < 0))))
        E_FATAL("Error in ctlfile: %s\n", line);

    if (k < 4) {
        /* Create utt-id from mfc-filename (and sf/ef if specified) */
        base = path2basename(uttfile);
        /* strip_fileext (base, uttid); */
        strcpy(uttid, base);

        if (k == 3) {
            k = strlen(uttid);
            sprintf(uttid + k, "_%d_%d", *sf, *ef);
        }
        else {
            *sf = 0;
            *ef = -1;           /* Signifies "until EOF" */
        }
    }

    return 0;
}